

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

bool __thiscall dtc::fdt::device_tree::parse_define(device_tree *this,char *def)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *directory;
  undefined8 b;
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  input_buffer *this_00;
  mapped_type *this_01;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  undefined1 local_208 [8];
  property_ptr p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  undefined1 local_180 [8];
  text_input_buffer in;
  unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> raw;
  string name_copy;
  undefined1 local_80 [8];
  string name;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string name_1;
  char *val;
  char *def_local;
  device_tree *this_local;
  
  name_1.field_2._8_8_ = strchr(def,0x3d);
  if ((char *)name_1.field_2._8_8_ == (char *)0x0) {
    sVar2 = strlen(def);
    if (sVar2 == 0) {
      this_local._7_1_ = false;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_48,def,&local_49);
      std::allocator<char>::~allocator(&local_49);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>_>_>
      ::operator[](&this->defines,(key_type *)local_48);
      this_local._7_1_ = true;
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  else {
    uVar3 = name_1.field_2._8_8_ - (long)def;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_80,def,uVar3,(allocator *)(name_copy.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(name_copy.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)&raw,(string *)local_80);
    name_1.field_2._8_8_ = name_1.field_2._8_8_ + 1;
    this_00 = (input_buffer *)operator_new(0x18);
    b = name_1.field_2._8_8_;
    sVar2 = strlen((char *)name_1.field_2._8_8_);
    input_buffer::input_buffer(this_00,(char *)b,(int)sVar2);
    std::unique_ptr<dtc::input_buffer,std::default_delete<dtc::input_buffer>>::
    unique_ptr<std::default_delete<dtc::input_buffer>,void>
              ((unique_ptr<dtc::input_buffer,std::default_delete<dtc::input_buffer>> *)&in.depfile,
               this_00);
    local_1b8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_1b8._M_h._M_rehash_policy._4_4_ = 0;
    local_1b8._M_h._M_rehash_policy._M_next_resize = 0;
    local_1b8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1b8._M_h._M_element_count = 0;
    local_1b8._M_h._M_buckets = (__buckets_ptr)0x0;
    local_1b8._M_h._M_bucket_count = 0;
    local_1b8._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::unordered_set(&local_1b8);
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1d8);
    directory = &p.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::string((string *)directory);
    text_input_buffer::text_input_buffer
              ((text_input_buffer *)local_180,
               (unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> *)&in.depfile
               ,&local_1b8,&local_1d8,(string *)directory,(FILE *)0x0);
    std::__cxx11::string::~string
              ((string *)
               &p.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d8);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unordered_set(&local_1b8);
    local_248._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_248._M_h._M_rehash_policy._4_4_ = 0;
    local_248._M_h._M_rehash_policy._M_next_resize = 0;
    local_248._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_248._M_h._M_element_count = 0;
    local_248._M_h._M_buckets = (__buckets_ptr)0x0;
    local_248._M_h._M_bucket_count = 0;
    local_248._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::unordered_set(&local_248);
    property::parse((property *)local_208,(text_input_buffer *)local_180,(string *)&raw,&local_248,
                    false,(define_map *)0x0);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unordered_set(&local_248);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_208);
    if (bVar1) {
      this_01 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>_>_>
                ::operator[](&this->defines,(key_type *)local_80);
      std::shared_ptr<dtc::fdt::property>::operator=
                (this_01,(shared_ptr<dtc::fdt::property> *)local_208);
    }
    this_local._7_1_ = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_208);
    std::shared_ptr<dtc::fdt::property>::~shared_ptr((shared_ptr<dtc::fdt::property> *)local_208);
    text_input_buffer::~text_input_buffer((text_input_buffer *)local_180);
    std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>::~unique_ptr
              ((unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> *)&in.depfile
              );
    std::__cxx11::string::~string((string *)&raw);
    std::__cxx11::string::~string((string *)local_80);
  }
  return this_local._7_1_;
}

Assistant:

bool device_tree::parse_define(const char *def)
{
	const char *val = strchr(def, '=');
	if (!val)
	{
		if (strlen(def) != 0)
		{
			string name(def);
			defines[name];
			return true;
		}
		return false;
	}
	string name(def, val-def);
	string name_copy = name;
	val++;
	std::unique_ptr<input_buffer> raw(new input_buffer(val, strlen(val)));
	text_input_buffer in(std::move(raw),
	                     std::unordered_set<string>(),
	                     std::vector<string>(),
	                     string(),
	                     nullptr);
	property_ptr p = property::parse(in, std::move(name_copy), string_set(), false);
	if (p)
		defines[name] = p;
	return (bool)p;
}